

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::SetLayerScale(PixelGameEngine *this,uint8_t layer,vf2d *scale)

{
  vf2d *scale_local;
  uint8_t layer_local;
  PixelGameEngine *this_local;
  
  SetLayerScale(this,layer,scale->x,scale->y);
  return;
}

Assistant:

void PixelGameEngine::SetLayerScale(uint8_t layer, const olc::vf2d &scale)
	{
		SetLayerScale(layer, scale.x, scale.y);
	}